

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeShadowTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeShadowTestInstance *this)

{
  int iVar1;
  deUint32 width;
  deUint32 height;
  TestContext *pTVar2;
  TestLog *log_00;
  reference pvVar3;
  MessageBuilder *pMVar4;
  reference pvVar5;
  TextureFormat texFormat;
  TextureCube *pTVar6;
  size_type sVar7;
  PixelFormat PVar8;
  allocator<char> local_939;
  string local_938;
  int local_918;
  allocator<char> local_911;
  string local_910;
  MessageBuilder local_8f0;
  ConstPixelBufferAccess local_770;
  undefined1 local_745;
  undefined1 auStack_744 [7];
  bool isOk;
  int local_73c;
  MessageBuilder local_738;
  ConstPixelBufferAccess local_5b8;
  undefined1 local_589;
  undefined1 auStack_588 [7];
  bool isHighQuality;
  int local_580;
  Vector<int,_3> local_57c;
  undefined1 local_570 [8];
  TexComparePrecision texComparePrecision;
  LodPrecision lodPrecision;
  undefined1 local_538 [8];
  PixelFormat pixelFormat;
  MessageBuilder local_520;
  undefined1 local_3a0 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  CubeFace face;
  int faceNdx;
  Sampler local_1e8;
  undefined1 local_1ac [8];
  ReferenceParams sampleParams;
  TestTextureCube *texture;
  FilterCase *curCase;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ScopedLogSection local_28;
  ScopedLogSection iterSection;
  TestLog *log;
  TextureCubeShadowTestInstance *this_local;
  
  pTVar2 = Context::getTestContext((this->super_TestInstance).m_context);
  log_00 = tcu::TestContext::getLog(pTVar2);
  iterSection.m_log = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Test",&local_69);
  de::toString<int>(&local_a0,&this->m_caseNdx);
  std::operator+(&local_48,&local_68,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Test ",&local_e1);
  de::toString<int>((string *)&curCase,&this->m_caseNdx);
  std::operator+(&local_c0,&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curCase);
  tcu::ScopedLogSection::ScopedLogSection(&local_28,log_00,&local_48,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&curCase);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pvVar3 = std::
           vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
           ::operator[](&this->m_cases,(long)this->m_caseNdx);
  sampleParams._140_8_ =
       util::TextureRenderer::getCubeTexture(&this->m_renderer,pvVar3->textureIndex);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_1ac,TEXTURETYPE_CUBE);
  util::createSampler(&local_1e8,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_1e8);
  sampleParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
  sampleParams.sampler.lodThreshold =
       (float)(this->m_testParameters->super_TextureShadowCommonTestCaseParameters).compareOp;
  local_1ac._4_4_ = SAMPLERTYPE_SHADOW;
  sampleParams.sampler.seamlessCubeMap = false;
  sampleParams.sampler._53_3_ = 0;
  sampleParams.super_RenderParams.w.m_data[3] = pvVar3->ref;
  tcu::TestLog::operator<<
            ((MessageBuilder *)&face,iterSection.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&face,(char (*) [27])"Compare reference value = ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,sampleParams.super_RenderParams.w.m_data + 3);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x134b284);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])"Coordinates: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pvVar3->bottomLeft);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [5])" -> ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pvVar3->topRight);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&face);
  for (result.m_pixels.m_cap._4_4_ = CUBEFACE_NEGATIVE_X; (int)result.m_pixels.m_cap._4_4_ < 6;
      result.m_pixels.m_cap._4_4_ = result.m_pixels.m_cap._4_4_ + CUBEFACE_POSITIVE_X) {
    width = util::TextureRenderer::getRenderWidth(&this->m_renderer);
    height = util::TextureRenderer::getRenderHeight(&this->m_renderer);
    tcu::Surface::Surface
              ((Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,width,height);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_3a0);
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)local_3a0,result.m_pixels.m_cap._4_4_,
               &pvVar3->bottomLeft,&pvVar3->topRight);
    tcu::TestLog::operator<<
              (&local_520,iterSection.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_520,(char (*) [6])"Face ");
    pixelFormat._8_8_ = getFaceDesc(result.m_pixels.m_cap._4_4_);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char **)&pixelFormat.blueBits);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_520);
    iVar1 = pvVar3->textureIndex;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_3a0,0);
    util::TextureRenderer::renderQuad
              (&this->m_renderer,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,iVar1,pvVar5,(ReferenceParams *)local_1ac)
    ;
    texFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    PVar8 = getPixelFormat(texFormat);
    pixelFormat._0_8_ = PVar8._8_8_;
    local_538 = PVar8._0_8_;
    tcu::LodPrecision::LodPrecision((LodPrecision *)&texComparePrecision.referenceBits,RULE_VULKAN);
    tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_570);
    texComparePrecision.resultBits = 10;
    tcu::Vector<int,_3>::Vector(&local_57c,10,10,10);
    texComparePrecision.coordBits.m_data[0] = local_57c.m_data[2];
    local_570._0_4_ = local_57c.m_data[0];
    local_570._4_4_ = local_57c.m_data[1];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_588,6,6,0);
    texComparePrecision.uvwBits.m_data[0] = local_580;
    texComparePrecision.coordBits.m_data[1] = auStack_588._0_4_;
    texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffffa7c;
    texComparePrecision.uvwBits.m_data[1] = 5;
    texComparePrecision.uvwBits.m_data[2] = 0x10;
    texComparePrecision.pcfBits = local_538._0_4_ + -1;
    pTVar2 = Context::getTestContext((this->super_TestInstance).m_context);
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_5b8,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pTVar6 = (TextureCube *)(**(code **)(*(long *)sampleParams._140_8_ + 0x80))();
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_3a0,0);
    local_589 = verifyTexCompareResult<tcu::TextureCube>
                          (pTVar2,&local_5b8,pTVar6,pvVar5,(ReferenceParams *)local_1ac,
                           (TexComparePrecision *)local_570,
                           (LodPrecision *)&texComparePrecision.referenceBits,
                           (PixelFormat *)local_538);
    if ((bool)local_589) {
LAB_00eb4d3f:
      local_918 = 0;
    }
    else {
      tcu::TestLog::operator<<
                (&local_738,iterSection.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_738,
                          (char (*) [66])
                          "Warning: Verification assuming high-quality PCF filtering failed.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_738);
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_744,4,4,0);
      texComparePrecision.uvwBits.m_data[0] = local_73c;
      texComparePrecision.coordBits.m_data[1] = auStack_744._0_4_;
      texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffff8c0;
      texComparePrecision.uvwBits.m_data[1] = 0;
      pTVar2 = Context::getTestContext((this->super_TestInstance).m_context);
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_770,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pTVar6 = (TextureCube *)(**(code **)(*(long *)sampleParams._140_8_ + 0x80))();
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_3a0,0);
      local_745 = verifyTexCompareResult<tcu::TextureCube>
                            (pTVar2,&local_770,pTVar6,pvVar5,(ReferenceParams *)local_1ac,
                             (TexComparePrecision *)local_570,
                             (LodPrecision *)&texComparePrecision.referenceBits,
                             (PixelFormat *)local_538);
      if ((bool)local_745) goto LAB_00eb4d3f;
      tcu::TestLog::operator<<
                (&local_8f0,iterSection.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_8f0,
                          (char (*) [82])
                          "ERROR: Verification against low precision requirements failed, failing test case."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"Image verification failed",&local_911);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_910);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator(&local_911);
      local_918 = 1;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_3a0);
    tcu::Surface::~Surface
              ((Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_918 != 0) goto LAB_00eb4ed4;
  }
  this->m_caseNdx = this->m_caseNdx + 1;
  iVar1 = this->m_caseNdx;
  sVar7 = std::
          vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
          ::size(&this->m_cases);
  if (iVar1 < (int)sVar7) {
    tcu::TestStatus::incomplete();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"Pass",&local_939);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator(&local_939);
  }
  local_918 = 1;
LAB_00eb4ed4:
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeShadowTestInstance::iterate (void)
{

	tcu::TestLog&						log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection			iterSection		(log, string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&					curCase			= m_cases[m_caseNdx];
	const pipeline::TestTextureCube&	texture			= m_renderer.getCubeTexture(curCase.textureIndex);

	ReferenceParams						sampleParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	sampleParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= m_testParameters.compareOp;
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	log	<< TestLog::Message
		<< "Compare reference value = " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(result, curCase.textureIndex, &texCoord[0], sampleParams);

		{
			const tcu::PixelFormat		pixelFormat			= getPixelFormat(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			tcu::LodPrecision			lodPrecision		(tcu::LodPrecision::RULE_VULKAN);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				log << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}